

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b-plus-tree.cpp
# Opt level: O3

void __thiscall BPTree::removeInternal(BPTree *this,keys_struct *x,Node *cursor,Node *child)

{
  vector<void_*,_std::allocator<void_*>_> *__x;
  void *pvVar1;
  keys_struct *pkVar2;
  uint uVar3;
  ostream *poVar4;
  Node *cursor_00;
  int iVar5;
  int iVar6;
  uint uVar7;
  keys_struct *pkVar8;
  ulong uVar9;
  long lVar10;
  ulong extraout_RDX;
  ulong uVar11;
  ulong uVar12;
  char *pcVar13;
  BPTree *pBVar14;
  Node **ppNVar15;
  uint uVar16;
  Node *pNVar17;
  int *piVar18;
  pointer *pppvVar19;
  pointer ppvVar20;
  long lVar21;
  long lVar22;
  bool bVar23;
  keys_struct local_70;
  keys_struct local_50;
  
  uVar3 = cursor->size;
  if (uVar3 == 1 && this->root == cursor) {
    if (cursor->ptr[1] == child) {
      pkVar8 = child->key;
      if (pkVar8 != (keys_struct *)0x0) {
        ppvVar20 = pkVar8[-1].add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        pppvVar19 = &pkVar8[-1].add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage;
        if (ppvVar20 != (pointer)0x0) {
          lVar10 = (long)ppvVar20 << 5;
          do {
            pvVar1 = *(void **)((long)pkVar8 + lVar10 + -0x18);
            if (pvVar1 != (void *)0x0) {
              operator_delete(pvVar1,*(long *)((long)pppvVar19 + lVar10) - (long)pvVar1);
            }
            lVar10 = lVar10 + -0x20;
          } while (lVar10 != 0);
        }
        operator_delete__(pppvVar19,(long)ppvVar20 << 5 | 8);
      }
      if (child->ptr != (Node **)0x0) {
        operator_delete__(child->ptr);
      }
      operator_delete(child,0x20);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Deleted 1",9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      ppNVar15 = cursor->ptr;
      this->root = *ppNVar15;
      pkVar8 = cursor->key;
      if (pkVar8 == (keys_struct *)0x0) goto LAB_0011ab12;
      ppvVar20 = pkVar8[-1].add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      pppvVar19 = &pkVar8[-1].add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      if (ppvVar20 != (pointer)0x0) {
        lVar10 = (long)ppvVar20 << 5;
        do {
          pvVar1 = *(void **)((long)pkVar8 + lVar10 + -0x18);
          if (pvVar1 != (void *)0x0) {
            operator_delete(pvVar1,*(long *)((long)pppvVar19 + lVar10) - (long)pvVar1);
          }
          lVar10 = lVar10 + -0x20;
        } while (lVar10 != 0);
      }
LAB_0011aaf6:
      operator_delete__(pppvVar19,(long)ppvVar20 << 5 | 8);
      ppNVar15 = cursor->ptr;
      if (ppNVar15 != (Node **)0x0) goto LAB_0011ab12;
    }
    else {
      if (*cursor->ptr != child) {
        uVar3 = 1;
        goto LAB_0011a7ae;
      }
      pkVar8 = child->key;
      if (pkVar8 != (keys_struct *)0x0) {
        ppvVar20 = pkVar8[-1].add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        pppvVar19 = &pkVar8[-1].add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage;
        if (ppvVar20 != (pointer)0x0) {
          lVar10 = (long)ppvVar20 << 5;
          do {
            pvVar1 = *(void **)((long)pkVar8 + lVar10 + -0x18);
            if (pvVar1 != (void *)0x0) {
              operator_delete(pvVar1,*(long *)((long)pppvVar19 + lVar10) - (long)pvVar1);
            }
            lVar10 = lVar10 + -0x20;
          } while (lVar10 != 0);
        }
        operator_delete__(pppvVar19,(long)ppvVar20 << 5 | 8);
      }
      if (child->ptr != (Node **)0x0) {
        operator_delete__(child->ptr);
      }
      operator_delete(child,0x20);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Deleted 1",9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      ppNVar15 = cursor->ptr;
      this->root = ppNVar15[1];
      pkVar8 = cursor->key;
      if (pkVar8 != (keys_struct *)0x0) {
        ppvVar20 = pkVar8[-1].add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        pppvVar19 = &pkVar8[-1].add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage;
        if (ppvVar20 != (pointer)0x0) {
          lVar10 = (long)ppvVar20 << 5;
          do {
            pvVar1 = *(void **)((long)pkVar8 + lVar10 + -0x18);
            if (pvVar1 != (void *)0x0) {
              operator_delete(pvVar1,*(long *)((long)pppvVar19 + lVar10) - (long)pvVar1);
            }
            lVar10 = lVar10 + -0x20;
          } while (lVar10 != 0);
        }
        goto LAB_0011aaf6;
      }
LAB_0011ab12:
      operator_delete__(ppNVar15);
    }
    operator_delete(cursor,0x20);
    poVar4 = (ostream *)&std::cout;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Deleted 1",9);
    pcVar13 = "\n";
    lVar10 = 1;
    goto LAB_0011ab4b;
  }
  if ((int)uVar3 < 1) {
    uVar11 = 0;
LAB_0011a8dc:
    if ((int)uVar11 < (int)uVar3) {
      lVar10 = (uVar11 & 0xffffffff) * 0x20 + 0x28;
      do {
        pkVar8 = cursor->key;
        *(undefined4 *)((long)pkVar8 + lVar10 + -0x28) = *(undefined4 *)((long)pkVar8 + lVar10 + -8)
        ;
        std::vector<void_*,_std::allocator<void_*>_>::operator=
                  ((vector<void_*,_std::allocator<void_*>_> *)((long)&pkVar8[-1].key_value + lVar10)
                   ,(vector<void_*,_std::allocator<void_*>_> *)((long)&pkVar8->key_value + lVar10));
        uVar3 = cursor->size;
        lVar10 = lVar10 + 0x20;
        uVar16 = (int)uVar11 + 1;
        uVar11 = (ulong)uVar16;
      } while ((int)uVar16 < (int)uVar3);
    }
    if (-1 < (int)uVar3) goto LAB_0011a924;
    uVar11 = 0;
  }
  else {
LAB_0011a7ae:
    pkVar8 = cursor->key;
    uVar11 = 0;
    do {
      if ((pkVar8->key_value == x->key_value) && (!NAN(pkVar8->key_value) && !NAN(x->key_value)))
      goto LAB_0011a8dc;
      uVar11 = uVar11 + 1;
      pkVar8 = pkVar8 + 1;
    } while (uVar3 != uVar11);
LAB_0011a924:
    uVar11 = (ulong)(uVar3 + 1);
    uVar9 = 0;
    do {
      if (cursor->ptr[uVar9] == child) {
        uVar11 = uVar9 & 0xffffffff;
        break;
      }
      uVar9 = uVar9 + 1;
    } while (uVar11 != uVar9);
  }
  piVar18 = &cursor->size;
  if ((int)uVar11 <= (int)uVar3) {
    iVar5 = (int)uVar11 + -1;
    do {
      cursor->ptr[uVar11] = cursor->ptr[uVar11 + 1];
      iVar5 = iVar5 + 1;
      uVar11 = uVar11 + 1;
    } while (iVar5 < (int)uVar3);
  }
  *piVar18 = uVar3 - 1;
  if ((int)uVar3 < 3) {
    if (this->root == cursor) {
      return;
    }
    pBVar14 = this;
    cursor_00 = findParent(this,this->root,cursor);
    iVar5 = (int)pBVar14;
    uVar3 = cursor_00->size;
    ppNVar15 = cursor_00->ptr;
    if (-1 < (int)uVar3) {
      uVar16 = uVar3 + 1;
      uVar11 = (ulong)uVar3 + 1;
      uVar9 = 0;
LAB_0011aa02:
      if (ppNVar15[uVar9] != cursor) goto code_r0x0011aa0c;
      bVar23 = uVar9 != 0;
      uVar11 = uVar9 - 1;
      uVar7 = (uint)uVar11;
      if (bVar23) {
        uVar12 = uVar11 & 0xffffffff;
        pNVar17 = ppNVar15[uVar12];
        if (pNVar17->size < 3) goto LAB_0011ab87;
        lVar10 = (long)*piVar18;
        if (0 < lVar10) {
          uVar11 = lVar10 + 1;
          uVar9 = lVar10 << 5 | 8;
          do {
            pkVar8 = cursor->key;
            *(undefined4 *)((long)pkVar8 + (uVar9 - 8)) =
                 *(undefined4 *)((long)pkVar8 + (uVar9 - 0x28));
            std::vector<void_*,_std::allocator<void_*>_>::operator=
                      ((vector<void_*,_std::allocator<void_*>_> *)((long)&pkVar8->key_value + uVar9)
                       ,(vector<void_*,_std::allocator<void_*>_> *)
                        ((long)&pkVar8[-1].key_value + uVar9));
            uVar11 = uVar11 - 1;
            uVar9 = uVar9 - 0x20;
          } while (1 < uVar11);
        }
        pkVar8 = cursor_00->key;
        pkVar2 = cursor->key;
        pkVar2->key_value = pkVar8[uVar12].key_value;
        std::vector<void_*,_std::allocator<void_*>_>::operator=
                  (&pkVar2->add_vect,&pkVar8[uVar12].add_vect);
        pkVar8 = pNVar17->key;
        iVar5 = pNVar17->size;
        pkVar2 = cursor_00->key;
        pkVar2[uVar12].key_value = pkVar8[(long)iVar5 + -1].key_value;
        std::vector<void_*,_std::allocator<void_*>_>::operator=
                  (&pkVar2[uVar12].add_vect,&pkVar8[(long)iVar5 + -1].add_vect);
        iVar5 = cursor->size;
        uVar11 = (ulong)(iVar5 + 1U);
        if (-1 < iVar5) {
          iVar6 = iVar5 + 2;
          do {
            cursor->ptr[uVar11] = cursor->ptr[uVar11 - 1];
            uVar11 = uVar11 - 1;
            iVar6 = iVar6 + -1;
          } while (1 < iVar6);
        }
        *cursor->ptr = pNVar17->ptr[pNVar17->size];
        cursor->size = iVar5 + 1U;
        goto LAB_0011ad60;
      }
LAB_0011ab87:
      uVar16 = (uint)uVar9;
      iVar5 = uVar16 + 1;
      if ((int)uVar16 < (int)uVar3) goto LAB_0011ab93;
      goto LAB_0011aba6;
    }
    uVar16 = 0;
    bVar23 = false;
    uVar11 = extraout_RDX;
LAB_0011ab93:
    uVar7 = (uint)uVar11;
    pNVar17 = ppNVar15[iVar5];
    if (pNVar17->size < 3) {
LAB_0011aba6:
      if (bVar23) {
        pNVar17 = ppNVar15[uVar7];
        pkVar8 = cursor_00->key;
        pkVar2 = pNVar17->key;
        iVar5 = pNVar17->size;
        pkVar2[iVar5].key_value = pkVar8[uVar7].key_value;
        std::vector<void_*,_std::allocator<void_*>_>::operator=
                  (&pkVar2[iVar5].add_vect,&pkVar8[uVar7].add_vect);
        iVar5 = *piVar18;
        if (0 < iVar5) {
          iVar6 = pNVar17->size;
          lVar21 = 8;
          lVar10 = 0;
          do {
            pkVar8 = cursor->key;
            pkVar2 = pNVar17->key;
            pkVar2[(long)iVar6 + 1].key_value = *(float *)((long)pkVar8 + lVar21 + -8);
            std::vector<void_*,_std::allocator<void_*>_>::operator=
                      (&pkVar2[(long)iVar6 + 1].add_vect,
                       (vector<void_*,_std::allocator<void_*>_> *)
                       ((long)&pkVar8->key_value + lVar21));
            lVar10 = lVar10 + 1;
            iVar5 = cursor->size;
            lVar21 = lVar21 + 0x20;
          } while (lVar10 < iVar5);
        }
        iVar6 = pNVar17->size;
        if (-1 < iVar5) {
          uVar11 = 0;
          do {
            pNVar17->ptr[(long)iVar6 + 1] = cursor->ptr[uVar11];
            cursor->ptr[uVar11] = (Node *)0x0;
            uVar11 = uVar11 + 1;
          } while (iVar5 + 1 != uVar11);
        }
        pNVar17->size = iVar6 + iVar5 + 1;
        cursor->size = 0;
        local_50.key_value = cursor_00->key[uVar7].key_value;
        std::vector<void_*,_std::allocator<void_*>_>::vector
                  (&local_50.add_vect,&cursor_00->key[uVar7].add_vect);
        removeInternal(this,&local_50,cursor_00,cursor);
        local_70.add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_50.add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_70.add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_50.add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
      }
      else {
        if ((int)uVar3 < iVar5) {
          return;
        }
        pNVar17 = ppNVar15[iVar5];
        pkVar8 = cursor_00->key;
        lVar10 = (long)iVar5 + -1;
        pkVar2 = cursor->key;
        iVar5 = cursor->size;
        pkVar2[iVar5].key_value = pkVar8[lVar10].key_value;
        std::vector<void_*,_std::allocator<void_*>_>::operator=
                  (&pkVar2[iVar5].add_vect,&pkVar8[lVar10].add_vect);
        iVar5 = pNVar17->size;
        if (0 < iVar5) {
          iVar6 = *piVar18;
          lVar22 = 8;
          lVar21 = 0;
          do {
            pkVar8 = pNVar17->key;
            pkVar2 = cursor->key;
            pkVar2[(long)iVar6 + 1].key_value = *(float *)((long)pkVar8 + lVar22 + -8);
            std::vector<void_*,_std::allocator<void_*>_>::operator=
                      (&pkVar2[(long)iVar6 + 1].add_vect,
                       (vector<void_*,_std::allocator<void_*>_> *)
                       ((long)&pkVar8->key_value + lVar22));
            lVar21 = lVar21 + 1;
            iVar5 = pNVar17->size;
            lVar22 = lVar22 + 0x20;
          } while (lVar21 < iVar5);
        }
        iVar6 = *piVar18;
        if (-1 < iVar5) {
          uVar11 = 0;
          do {
            cursor->ptr[(long)iVar6 + 1] = pNVar17->ptr[uVar11];
            pNVar17->ptr[uVar11] = (Node *)0x0;
            uVar11 = uVar11 + 1;
          } while (iVar5 + 1 != uVar11);
        }
        *piVar18 = iVar6 + iVar5 + 1;
        pNVar17->size = 0;
        __x = &cursor_00->key[lVar10].add_vect;
        local_70.key_value = *(float *)((long)(__x + -1) + 0x10);
        std::vector<void_*,_std::allocator<void_*>_>::vector(&local_70.add_vect,__x);
        removeInternal(this,&local_70,cursor_00,pNVar17);
      }
      if (local_70.add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_70.add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_70.add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_70.add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      pkVar8 = cursor_00->key;
      pkVar2 = cursor->key;
      iVar5 = cursor->size;
      pkVar2[iVar5].key_value = pkVar8[uVar16].key_value;
      std::vector<void_*,_std::allocator<void_*>_>::operator=
                (&pkVar2[iVar5].add_vect,&pkVar8[uVar16].add_vect);
      pkVar8 = pNVar17->key;
      pkVar2 = cursor_00->key;
      pkVar2[uVar16].key_value = pkVar8->key_value;
      std::vector<void_*,_std::allocator<void_*>_>::operator=
                (&pkVar2[uVar16].add_vect,&pkVar8->add_vect);
      uVar3 = pNVar17->size;
      if (1 < (int)uVar3) {
        lVar10 = 0x28;
        lVar21 = 0;
        do {
          pkVar8 = pNVar17->key;
          lVar21 = lVar21 + 1;
          *(undefined4 *)((long)pkVar8 + lVar10 + -0x28) =
               *(undefined4 *)((long)pkVar8 + lVar10 + -8);
          std::vector<void_*,_std::allocator<void_*>_>::operator=
                    ((vector<void_*,_std::allocator<void_*>_> *)
                     ((long)&pkVar8[-1].key_value + lVar10),
                     (vector<void_*,_std::allocator<void_*>_> *)((long)&pkVar8->key_value + lVar10))
          ;
          uVar3 = pNVar17->size;
          lVar10 = lVar10 + 0x20;
        } while (lVar21 < (long)(int)uVar3 + -1);
      }
      iVar5 = cursor->size;
      cursor->ptr[(long)iVar5 + 1] = *pNVar17->ptr;
      if (0 < (int)uVar3) {
        uVar11 = 0;
        do {
          pNVar17->ptr[uVar11] = pNVar17->ptr[uVar11 + 1];
          uVar11 = uVar11 + 1;
        } while (uVar3 != uVar11);
      }
      *piVar18 = iVar5 + 1;
LAB_0011ad60:
      pNVar17->size = pNVar17->size + -1;
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Deleted ",8);
  poVar4 = std::ostream::_M_insert<double>((ostream *)&std::cout,(double)x->key_value);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  pcVar13 = " from internal node successfully\n";
  lVar10 = 0x21;
LAB_0011ab4b:
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar13,lVar10);
  return;
code_r0x0011aa0c:
  uVar9 = uVar9 + 1;
  if (uVar11 == uVar9) goto code_r0x0011aa14;
  goto LAB_0011aa02;
code_r0x0011aa14:
  bVar23 = false;
  goto LAB_0011ab93;
}

Assistant:

void removeInternal(keys_struct x, Node* cursor, Node* child)
    {
        //deleting the key x first
        //checking if key from root is to be deleted
        if(cursor == root)
        {
            if(cursor->size == 1)//if only one key is left, change root
            {
                if(cursor->ptr[1] == child)
                {
                    delete[] child->key;
                    delete[] child->ptr;
                    delete child;
                    cout << "Deleted 1" <<"\n";
                    root = cursor->ptr[0];
                    delete[] cursor->key;
                    delete[] cursor->ptr;
                    delete cursor;
                    cout << "Deleted 1" <<"\n";
                    //cout<<"Changed root node\n";
                    return;
                }
                else if(cursor->ptr[0] == child)
                {
                    delete[] child->key;
                    delete[] child->ptr;
                    delete child;
                    cout << "Deleted 1" <<"\n";
                    root = cursor->ptr[1];
                    delete[] cursor->key;
                    delete[] cursor->ptr;
                    delete cursor;
                    cout << "Deleted 1" <<"\n";
                    //cout<<"Changed root node\n";
                    return;
                }
            }
        }
        int pos;
        for(pos = 0; pos < cursor->size; pos++)
        {
            if(cursor->key[pos].key_value == x.key_value)
            {
                break;
            }
        }
        for(int i = pos; i < cursor->size; i++)
        {
            cursor->key[i] = cursor->key[i+1];
        }
        //now deleting the pointer child
        for(pos = 0; pos < cursor->size+1; pos++)
        {
            if(cursor->ptr[pos] == child)
            {
                break;
            }
        }
        for(int i = pos; i < cursor->size+1; i++)
        {
            cursor->ptr[i] = cursor->ptr[i+1];
        }
        cursor->size--;
        if(cursor->size >= (MAX+1)/2-1)//no underflow
        {
            cout<<"Deleted "<< x.key_value << " " <<" from internal node successfully\n";
            return;
        }
        //cout<<"Underflow in internal node!\n";
        //underflow, try to transfer first
        if(cursor==root)return;
        Node* parent = findParent(root, cursor);
        int leftSibling, rightSibling;
        //finding left n right sibling of cursor
        for(pos = 0; pos < parent->size+1; pos++)
        {
            if(parent->ptr[pos] == cursor)
            {
                leftSibling = pos - 1;
                rightSibling = pos + 1;
                break;
            }
        }
        //try to transfer
        if(leftSibling >= 0)//if left sibling exists
        {
            Node *leftNode = parent->ptr[leftSibling];
            //check if it is possible to transfer
            if(leftNode->size >= (MAX+1)/2)
            {
                //make space for transfer of key
                for(int i = cursor->size; i > 0; i--)
                {
                    cursor->key[i] = cursor->key[i-1];
                }
                //transfer key from left sibling through parent
                cursor->key[0] = parent->key[leftSibling];
                parent->key[leftSibling] = leftNode->key[leftNode->size-1];
                //transfer last pointer from leftnode to cursor
                //make space for transfer of ptr
                for (int i = cursor->size+1; i > 0; i--)
                {
                    cursor->ptr[i] = cursor->ptr[i-1];
                }
                //transfer ptr
                cursor->ptr[0] = leftNode->ptr[leftNode->size];
                cursor->size++;
                leftNode->size--;
                //cout<<"Transferred "<<cursor->key[0].key_value<<" "<< x.add_vect[0] <<" from left sibling of internal node\n";
                return;
            }
        }
        if(rightSibling <= parent->size)//check if right sibling exist
        {
            Node *rightNode = parent->ptr[rightSibling];
            //check if it is possible to transfer
            if(rightNode->size >= (MAX+1)/2)
            {
                //transfer key from right sibling through parent
                cursor->key[cursor->size] = parent->key[pos];
                parent->key[pos] = rightNode->key[0];
                for (int i = 0; i < rightNode->size -1; i++)
                {
                    rightNode->key[i] = rightNode->key[i+1];
                }
                //transfer first pointer from rightnode to cursor
                //transfer ptr
                cursor->ptr[cursor->size+1] = rightNode->ptr[0];
                for (int i = 0; i < rightNode->size; ++i)
                {
                    rightNode->ptr[i] = rightNode->ptr[i+1];
                }
                cursor->size++;
                rightNode->size--;
                //cout<<"Transferred "<<cursor->key[0].key_value << " " << x.add_vect[0] <<" from right sibling of internal node\n";
                return;
            }
        }
        //transfer wasnt posssible hence do merging
        if(leftSibling >= 0)
        {
            //leftnode + parent key + cursor
            Node *leftNode = parent->ptr[leftSibling];
            leftNode->key[leftNode->size] = parent->key[leftSibling];
            for(int i = leftNode->size+1, j = 0; j < cursor->size; j++)
            {
                leftNode->key[i] = cursor->key[j];
            }
            for(int i = leftNode->size+1, j = 0; j < cursor->size+1; j++)
            {
                leftNode->ptr[i] = cursor->ptr[j];
                cursor->ptr[j] = NULL;
            }
            leftNode->size += cursor->size+1;
            cursor->size = 0;
            //delete cursor
            removeInternal(parent->key[leftSibling], parent, cursor);
            //cout<<"Merged with left sibling\n";

        }
        else if(rightSibling <= parent->size)
        {
            //cursor + parent key + rightnode
            Node *rightNode = parent->ptr[rightSibling];
            cursor->key[cursor->size] = parent->key[rightSibling-1];
            for(int i = cursor->size+1, j = 0; j < rightNode->size; j++)
            {
                cursor->key[i] = rightNode->key[j];
            }
            for(int i = cursor->size+1, j = 0; j < rightNode->size+1; j++)
            {
                cursor->ptr[i] = rightNode->ptr[j];
                rightNode->ptr[j] = NULL;
            }
            cursor->size += rightNode->size+1;
            rightNode->size = 0;
            //delete cursor
            removeInternal(parent->key[rightSibling-1], parent, rightNode);
            //cout<<"Merged with right sibling\n";
        }
    }